

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void err_argmsg(lua_State *L,int narg,char *msg)

{
  char *pcVar1;
  char *ftype;
  char *fname;
  char *msg_local;
  lua_State *plStack_10;
  int narg_local;
  lua_State *L_local;
  
  ftype = "?";
  fname = msg;
  msg_local._4_4_ = narg;
  plStack_10 = L;
  pcVar1 = lj_debug_funcname(L,L->base + -1,&ftype);
  if (((int)msg_local._4_4_ < 0) && (-10000 < (int)msg_local._4_4_)) {
    msg_local._4_4_ =
         (int)((long)plStack_10->top - (long)plStack_10->base >> 3) + msg_local._4_4_ + 1;
  }
  if (((pcVar1 == (char *)0x0) || (pcVar1[3] != 'h')) ||
     (msg_local._4_4_ = msg_local._4_4_ - 1, msg_local._4_4_ != 0)) {
    fname = lj_strfmt_pushf(plStack_10,lj_err_allmsg + 0x1e7,(ulong)msg_local._4_4_,ftype,fname);
  }
  else {
    fname = lj_strfmt_pushf(plStack_10,lj_err_allmsg + 0x1c9,ftype,fname);
  }
  lj_err_callermsg(plStack_10,fname);
}

Assistant:

static void err_argmsg(lua_State *L, int narg,
					    const char *msg)
{
  const char *fname = "?";
  const char *ftype = lj_debug_funcname(L, L->base - 1, &fname);
  if (narg < 0 && narg > LUA_REGISTRYINDEX)
    narg = (int)(L->top - L->base) + narg + 1;
  if (ftype && ftype[3] == 'h' && --narg == 0)  /* Check for "method". */
    msg = lj_strfmt_pushf(L, err2msg(LJ_ERR_BADSELF), fname, msg);
  else
    msg = lj_strfmt_pushf(L, err2msg(LJ_ERR_BADARG), narg, fname, msg);
  lj_err_callermsg(L, msg);
}